

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O0

Aig_Obj_t * buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *pAigNew,ltlNode *pLtlNode)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *rightAigObj;
  Aig_Obj_t *leftAigObj;
  ltlNode *pLtlNode_local;
  Aig_Man_t *pAigNew_local;
  
  if (pLtlNode->pObj == (Aig_Obj_t *)0x0) {
    if (pLtlNode->type == BOOL) {
      __assert_fail("pLtlNode->type != BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                    ,0x236,
                    "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
    }
    switch(pLtlNode->type) {
    case AND:
      if (pLtlNode->left == (ltlNode_t *)0x0) {
        __assert_fail("pLtlNode->left",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x239,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      if (pLtlNode->right == (ltlNode_t *)0x0) {
        __assert_fail("pLtlNode->right",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x239,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      pAVar2 = buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode->left);
      pAVar1 = buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode->right);
      if (pAVar2 == (Aig_Obj_t *)0x0) {
        __assert_fail("leftAigObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x23c,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      if (pAVar1 == (Aig_Obj_t *)0x0) {
        __assert_fail("rightAigObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x23c,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      pAVar2 = Aig_And(pAigNew,pAVar2,pAVar1);
      pLtlNode->pObj = pAVar2;
      pAigNew_local = (Aig_Man_t *)pLtlNode->pObj;
      break;
    case OR:
      if (pLtlNode->left == (ltlNode_t *)0x0) {
        __assert_fail("pLtlNode->left",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x240,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      if (pLtlNode->right == (ltlNode_t *)0x0) {
        __assert_fail("pLtlNode->right",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x240,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      pAVar2 = buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode->left);
      pAVar1 = buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode->right);
      if (pAVar2 == (Aig_Obj_t *)0x0) {
        __assert_fail("leftAigObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x243,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      if (pAVar1 == (Aig_Obj_t *)0x0) {
        __assert_fail("rightAigObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x243,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      pAVar2 = Aig_Or(pAigNew,pAVar2,pAVar1);
      pLtlNode->pObj = pAVar2;
      pAigNew_local = (Aig_Man_t *)pLtlNode->pObj;
      break;
    case NOT:
      if (pLtlNode->left == (ltlNode_t *)0x0) {
        __assert_fail("pLtlNode->left",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x247,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      if (pLtlNode->right != (ltlNode_t *)0x0) {
        __assert_fail("pLtlNode->right == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x247,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      pAVar2 = buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode->left);
      if (pAVar2 == (Aig_Obj_t *)0x0) {
        __assert_fail("leftAigObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x249,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      pAVar2 = Aig_Not(pAVar2);
      pLtlNode->pObj = pAVar2;
      pAigNew_local = (Aig_Man_t *)pLtlNode->pObj;
      break;
    default:
      printf("\nSerious ERROR: attempting to create AIG node from a temporal node\n");
      exit(0);
    case GLOBALLY:
    case EVENTUALLY:
    case NEXT:
    case UNTIL:
      printf("FORBIDDEN node: ABORTING!!\n");
      exit(0);
    }
  }
  else {
    pAigNew_local = (Aig_Man_t *)pLtlNode->pObj;
  }
  return (Aig_Obj_t *)pAigNew_local;
}

Assistant:

Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly( Aig_Man_t *pAigNew, ltlNode *pLtlNode )
{
    Aig_Obj_t *leftAigObj, *rightAigObj;

    if( pLtlNode->pObj != NULL )
        return pLtlNode->pObj;
    else
    {
        assert( pLtlNode->type != BOOL );
        switch( pLtlNode->type ){
            case AND:
                assert( pLtlNode->left ); assert( pLtlNode->right );
                leftAigObj = buildLogicFromLTLNode_combinationalOnly( pAigNew, pLtlNode->left );
                rightAigObj = buildLogicFromLTLNode_combinationalOnly( pAigNew, pLtlNode->right );
                assert( leftAigObj ); assert( rightAigObj );
                pLtlNode->pObj = Aig_And( pAigNew, leftAigObj, rightAigObj );
                return pLtlNode->pObj;
            case OR:
                assert( pLtlNode->left ); assert( pLtlNode->right );
                leftAigObj = buildLogicFromLTLNode_combinationalOnly( pAigNew, pLtlNode->left );
                rightAigObj = buildLogicFromLTLNode_combinationalOnly( pAigNew, pLtlNode->right );
                assert( leftAigObj ); assert( rightAigObj );
                pLtlNode->pObj = Aig_Or( pAigNew, leftAigObj, rightAigObj );
                return pLtlNode->pObj;
            case NOT:
                assert( pLtlNode->left ); assert( pLtlNode->right == NULL ); 
                leftAigObj = buildLogicFromLTLNode_combinationalOnly( pAigNew, pLtlNode->left );
                assert( leftAigObj );
                pLtlNode->pObj = Aig_Not( leftAigObj );
                return pLtlNode->pObj;
            case GLOBALLY:
            case EVENTUALLY:
            case NEXT:
            case UNTIL:
                printf("FORBIDDEN node: ABORTING!!\n");
                exit(0);
            default:
                printf("\nSerious ERROR: attempting to create AIG node from a temporal node\n");
                exit(0);
        }
    }
}